

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles3::Functional::Framebuffer::createTex2D
          (Framebuffer *this,deUint32 name,GLenum format,int width,int height)

{
  deBool dVar1;
  int height_local;
  int width_local;
  GLenum format_local;
  deUint32 name_local;
  Framebuffer *this_local;
  
  width_local = name;
  _format_local = this;
  if (name == 0) {
    (*this->m_context->_vptr_Context[7])(this->m_context,1,&width_local);
  }
  (*this->m_context->_vptr_Context[6])(this->m_context,0xde1,(ulong)(uint)width_local);
  (*this->m_context->_vptr_Context[0x7e])
            (this->m_context,0xde1,0,(ulong)format,(ulong)(uint)width,(ulong)(uint)height);
  dVar1 = deIsPowerOfTwo32(width);
  if (dVar1 != 0) {
    dVar1 = deIsPowerOfTwo32(height);
    if (dVar1 != 0) goto LAB_00b66c31;
  }
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2802,0x812f);
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2803,0x812f);
LAB_00b66c31:
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2801,0x2600);
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2800,0x2600);
  return width_local;
}

Assistant:

deUint32 Framebuffer::createTex2D (deUint32 name, GLenum format, int width, int height)
{
	if (name == 0)
		m_context.genTextures(1, &name);

	m_context.bindTexture(GL_TEXTURE_2D, name);
	m_context.texImage2D(GL_TEXTURE_2D, 0, format, width, height);

	if (!deIsPowerOfTwo32(width) || !deIsPowerOfTwo32(height))
	{
		// Set wrap mode to clamp for NPOT FBOs
		m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	}

	m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	return name;
}